

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncInitializer.hpp
# Opt level: O0

ASYNC_TASK_STATUS __thiscall
Diligent::AsyncInitializer::Update(AsyncInitializer *this,bool WaitForCompletion)

{
  bool bVar1;
  ASYNC_TASK_STATUS AVar2;
  Char *Message;
  IAsyncTask *pIVar3;
  ASYNC_TASK_STATUS *pAVar4;
  char (*in_RCX) [40];
  lock_guard<Threading::SpinLock> local_70;
  SpinLockGuard Guard_1;
  ASYNC_TASK_STATUS NewStatus;
  lock_guard<Threading::SpinLock> local_58;
  SpinLockGuard Guard;
  RefCntAutoPtr<Diligent::IAsyncTask> pTask;
  undefined1 local_38 [8];
  string msg;
  ASYNC_TASK_STATUS CurrStatus;
  bool WaitForCompletion_local;
  AsyncInitializer *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  msg.field_2._8_4_ =
       std::atomic<Diligent::ASYNC_TASK_STATUS>::load
                 ((atomic<Diligent::ASYNC_TASK_STATUS> *)this,memory_order_seq_cst);
  if (msg.field_2._8_4_ == ASYNC_TASK_STATUS_UNKNOWN) {
    FormatString<char[26],char[40]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrStatus != ASYNC_TASK_STATUS_UNKNOWN",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Update",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AsyncInitializer.hpp"
               ,0x35);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((uint)msg.field_2._8_4_ < 3) {
    RefCntAutoPtr<Diligent::IAsyncTask>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IAsyncTask> *)&Guard);
    std::lock_guard<Threading::SpinLock>::lock_guard(&local_58,(mutex_type *)(this + 4));
    RefCntWeakPtr<Diligent::IAsyncTask>::Lock
              ((RefCntWeakPtr<Diligent::IAsyncTask> *)&stack0xffffffffffffffa0);
    RefCntAutoPtr<Diligent::IAsyncTask>::operator=
              ((RefCntAutoPtr<Diligent::IAsyncTask> *)&Guard,
               (RefCntAutoPtr<Diligent::IAsyncTask> *)&stack0xffffffffffffffa0);
    RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IAsyncTask> *)&stack0xffffffffffffffa0);
    std::lock_guard<Threading::SpinLock>::~lock_guard(&local_58);
    Guard_1._M_device._4_4_ = 0;
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&Guard);
    if (bVar1) {
      if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
        pIVar3 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&Guard);
        (**(code **)(*(long *)pIVar3 + 0x58))();
      }
      pIVar3 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                         ((RefCntAutoPtr<Diligent::IAsyncTask> *)&Guard);
      Guard_1._M_device._4_4_ = (**(code **)(*(long *)pIVar3 + 0x38))();
    }
    if ((Guard_1._M_device._4_4_ == 3) || (Guard_1._M_device._4_4_ == 4)) {
      std::lock_guard<Threading::SpinLock>::lock_guard(&local_70,(mutex_type *)(this + 4));
      RefCntWeakPtr<Diligent::IAsyncTask>::Release
                ((RefCntWeakPtr<Diligent::IAsyncTask> *)(this + 8));
      std::lock_guard<Threading::SpinLock>::~lock_guard(&local_70);
    }
    if ((uint)msg.field_2._8_4_ < Guard_1._M_device._4_4_) {
      do {
        pAVar4 = std::max<Diligent::ASYNC_TASK_STATUS>
                           ((ASYNC_TASK_STATUS *)(msg.field_2._M_local_buf + 8),
                            (ASYNC_TASK_STATUS *)((long)&Guard_1._M_device + 4));
        bVar1 = std::atomic<Diligent::ASYNC_TASK_STATUS>::compare_exchange_weak
                          ((atomic<Diligent::ASYNC_TASK_STATUS> *)this,
                           (ASYNC_TASK_STATUS *)(msg.field_2._M_local_buf + 8),*pAVar4,
                           memory_order_seq_cst);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
    RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IAsyncTask> *)&Guard);
  }
  AVar2 = std::atomic<Diligent::ASYNC_TASK_STATUS>::load
                    ((atomic<Diligent::ASYNC_TASK_STATUS> *)this,memory_order_seq_cst);
  return AVar2;
}

Assistant:

ASYNC_TASK_STATUS Update(bool WaitForCompletion)
    {
        ASYNC_TASK_STATUS CurrStatus = m_Status.load();
        VERIFY_EXPR(CurrStatus != ASYNC_TASK_STATUS_UNKNOWN);
        if (CurrStatus <= ASYNC_TASK_STATUS_RUNNING)
        {
            RefCntAutoPtr<IAsyncTask> pTask;
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                pTask = m_wpTask.Lock();
            }

            ASYNC_TASK_STATUS NewStatus = ASYNC_TASK_STATUS_UNKNOWN;
            if (pTask)
            {
                if (WaitForCompletion)
                {
                    pTask->WaitForCompletion();
                }
                NewStatus = pTask->GetStatus();
            }

            if (NewStatus == ASYNC_TASK_STATUS_CANCELLED || NewStatus == ASYNC_TASK_STATUS_COMPLETE)
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                m_wpTask.Release();
            }

            if (NewStatus > CurrStatus)
            {
                while (!m_Status.compare_exchange_weak(CurrStatus, (std::max)(CurrStatus, NewStatus)))
                {
                    // If exchange fails, CurrStatus will hold the actual value of m_Status.
                }
            }
        }

        return m_Status.load();
    }